

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O2

void test_read_format_7zip_lzma2_arm64(void)

{
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                 ,L'Қ');
  test_skipping("This version of liblzma does not support LZMA_FILTER_ARM64");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_lzma2_arm64)
{
#ifdef LZMA_FILTER_ARM64
	struct archive *a;

	assert((a = archive_read_new()) != NULL);

	if (ARCHIVE_OK != archive_read_support_filter_lzma(a)) {
		skipping(
		    "7zip:lzma decoding is not supported on this platform");
	} else {
		test_arm64_filter("test_read_format_7zip_lzma2_arm64.7z");
	}

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
#else
	skipping("This version of liblzma does not support LZMA_FILTER_ARM64");
#endif
}